

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scheduler.c
# Opt level: O0

__cilkrts_worker *
slow_path_reductions_for_spawn_return(__cilkrts_worker *w,full_frame *ff,cilkred_map **left_map_ptr)

{
  cilkred_map *pcVar1;
  __cilkrts_worker *in_RDX;
  full_frame *in_RSI;
  __cilkrts_worker *in_RDI;
  splice_left_ptrs left_ptrs;
  cilkred_map *right_map;
  cilkred_map *middle_map;
  cilkred_map *left_map;
  full_frame *in_stack_ffffffffffffffa8;
  __cilkrts_worker *w_00;
  splice_left_ptrs in_stack_ffffffffffffffb0;
  __cilkrts_worker *local_18;
  
  local_18 = in_RDX;
  while( true ) {
    if (local_18->tail == (__cilkrts_stack_frame **)0x0) {
      local_18->tail = (__cilkrts_stack_frame **)in_RDI->reducer_map;
      in_RDI->reducer_map = (cilkred_map *)0x0;
    }
    if (in_RDI->reducer_map == (cilkred_map *)0x0) {
      in_RDI->reducer_map = in_RSI->right_reducer_map;
      in_RSI->right_reducer_map = (cilkred_map *)0x0;
    }
    if (in_RDI->reducer_map == (cilkred_map *)0x0) {
      verify_current_wkr(in_RDI);
      return in_RDI;
    }
    local_18->tail = (__cilkrts_stack_frame **)0x0;
    in_RDI->reducer_map = (cilkred_map *)0x0;
    in_RSI->right_reducer_map = (cilkred_map *)0x0;
    w_00 = (__cilkrts_worker *)in_stack_ffffffffffffffb0.map_ptr;
    __cilkrts_frame_unlock(w_00,in_stack_ffffffffffffffa8);
    repeated_merge_reducer_maps
              ((__cilkrts_worker **)w_00,(cilkred_map *)in_stack_ffffffffffffffa8,
               (cilkred_map *)0x11744d);
    verify_current_wkr(in_RDI);
    pcVar1 = repeated_merge_reducer_maps
                       ((__cilkrts_worker **)w_00,(cilkred_map *)in_stack_ffffffffffffffa8,
                        (cilkred_map *)0x117470);
    verify_current_wkr(in_RDI);
    if (in_RDI->reducer_map != (cilkred_map *)0x0) {
      __cilkrts_bug("%s:%d: cilk assertion failed: %s\n",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/passlab[P]intel-cilk-runtime/runtime/scheduler.c"
                    ,0xe76,"NULL == w->reducer_map");
    }
    in_RDI->reducer_map = pcVar1;
    if (in_RSI->pending_exception != (pending_exception_info *)0x0) break;
    in_RSI->pending_exception = in_RDI->l->pending_exception;
    in_RDI->l->pending_exception = (pending_exception_info *)0x0;
    __cilkrts_frame_lock(w_00,in_stack_ffffffffffffffa8);
    in_stack_ffffffffffffffb0 = compute_left_ptrs_for_spawn_return(in_RDI,in_RSI);
    local_18 = (__cilkrts_worker *)in_stack_ffffffffffffffb0.map_ptr;
    splice_exceptions_for_spawn
              (local_18,in_stack_ffffffffffffffa8,(pending_exception_info **)0x1175b0);
  }
  __cilkrts_bug("%s:%d: cilk assertion failed: %s\n",
                "/workspace/llm4binary/github/license_all_cmakelists_25/passlab[P]intel-cilk-runtime/runtime/scheduler.c"
                ,0xe7d,"NULL == ff->pending_exception");
}

Assistant:

static __cilkrts_worker*
slow_path_reductions_for_spawn_return(__cilkrts_worker *w,
                                      full_frame *ff,
                                      struct cilkred_map **left_map_ptr)
{

    // CILK_ASSERT: w is holding frame lock on parent_ff.
#if REDPAR_DEBUG > 0
    CILK_ASSERT(!ff->rightmost_child);
    CILK_ASSERT(!ff->is_call_child);
#endif

    // Loop invariant:
    // When beginning this loop, we should
    //   1. Be holding the lock on ff->parent.
    //   2. left_map_ptr should be the address of the pointer to the left map.
    //   3. All maps should be slid over left by one, if possible.
    //   4. All exceptions should be merged so far.
    while (1) {
        
        // Slide middle map left if possible.
        if (!(*left_map_ptr)) {
            *left_map_ptr = w->reducer_map;
            w->reducer_map = NULL;
        }
        // Slide right map to middle if possible.
        if (!w->reducer_map) {
            w->reducer_map = ff->right_reducer_map;
            ff->right_reducer_map = NULL;
        }

        // Since we slid everything left by one,
        // we are finished if there is no middle map.
        if (!w->reducer_map) {
            verify_current_wkr(w);
            return w;
        }
        else {
            struct cilkred_map* left_map;
            struct cilkred_map* middle_map;
            struct cilkred_map* right_map;

            // Take all the maps from their respective locations.
            // We can't leave them in place and execute a reduction because these fields
            // might change once we release the lock.
            left_map = *left_map_ptr;
            *left_map_ptr = NULL;
            middle_map = w->reducer_map;
            w->reducer_map = NULL;
            right_map = ff->right_reducer_map;
            ff->right_reducer_map = NULL;
        
            // WARNING!!! Lock release here.
            // We have reductions to execute (and we can't hold locks).
            __cilkrts_frame_unlock(w, ff->parent);

            // After we've released the lock, start counting time as
            // WORKING again.
            STOP_INTERVAL(w, INTERVAL_IN_RUNTIME);
            START_INTERVAL(w, INTERVAL_WORKING);

            // Merge all reducers into the left map.
            left_map = repeated_merge_reducer_maps(&w,
                                                   left_map,
                                                   middle_map);
            verify_current_wkr(w);
            left_map = repeated_merge_reducer_maps(&w,
                                                   left_map,
                                                   right_map);
            verify_current_wkr(w);
            CILK_ASSERT(NULL == w->reducer_map);
            // Put the final answer back into w->reducer_map.
            w->reducer_map = left_map;
            
            // Save any exceptions generated because of the reduction
            // process from the returning worker.  These get merged
            // the next time around the loop.
            CILK_ASSERT(NULL == ff->pending_exception);
            ff->pending_exception = w->l->pending_exception;
            w->l->pending_exception = NULL;

            STOP_INTERVAL(w, INTERVAL_WORKING);
            START_INTERVAL(w, INTERVAL_IN_RUNTIME);

            // Lock ff->parent for the next loop around.
            __cilkrts_frame_lock(w, ff->parent);

            // Once we have the lock again, recompute who is to our
            // left.
            splice_left_ptrs left_ptrs;
            left_ptrs = compute_left_ptrs_for_spawn_return(w, ff);

            // Update the pointer for the left map.
            left_map_ptr = left_ptrs.map_ptr;
            // Splice the exceptions for spawn.
            splice_exceptions_for_spawn(w, ff, left_ptrs.exception_ptr);
        }
    }
    // We should never break out of this loop.
    
    CILK_ASSERT(0);
    return NULL;
}